

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Status XML_ResumeParser(XML_Parser parser)

{
  XML_Parsing XVar1;
  XML_Error XVar2;
  XML_Status local_1c;
  XML_Status result;
  XML_Parser parser_local;
  
  local_1c = XML_STATUS_OK;
  if (parser == (XML_Parser)0x0) {
    parser_local._4_4_ = XML_STATUS_ERROR;
  }
  else if ((parser->m_parsingStatus).parsing == XML_SUSPENDED) {
    (parser->m_parsingStatus).parsing = XML_PARSING;
    XVar2 = (*parser->m_processor)
                      (parser,parser->m_bufferPtr,parser->m_parseEndPtr,&parser->m_bufferPtr);
    parser->m_errorCode = XVar2;
    if (parser->m_errorCode == XML_ERROR_NONE) {
      XVar1 = (parser->m_parsingStatus).parsing;
      if (XVar1 < XML_FINISHED) {
        if ((parser->m_parsingStatus).finalBuffer != '\0') {
          (parser->m_parsingStatus).parsing = XML_FINISHED;
          return XML_STATUS_OK;
        }
      }
      else if (XVar1 == XML_SUSPENDED) {
        local_1c = XML_STATUS_SUSPENDED;
      }
      (*parser->m_encoding->updatePosition)
                (parser->m_encoding,parser->m_positionPtr,parser->m_bufferPtr,&parser->m_position);
      parser->m_positionPtr = parser->m_bufferPtr;
      parser_local._4_4_ = local_1c;
    }
    else {
      parser->m_eventEndPtr = parser->m_eventPtr;
      parser->m_processor = errorProcessor;
      parser_local._4_4_ = XML_STATUS_ERROR;
    }
  }
  else {
    parser->m_errorCode = XML_ERROR_NOT_SUSPENDED;
    parser_local._4_4_ = XML_STATUS_ERROR;
  }
  return parser_local._4_4_;
}

Assistant:

enum XML_Status XMLCALL
XML_ResumeParser(XML_Parser parser) {
  enum XML_Status result = XML_STATUS_OK;

  if (parser == NULL)
    return XML_STATUS_ERROR;
  if (parser->m_parsingStatus.parsing != XML_SUSPENDED) {
    parser->m_errorCode = XML_ERROR_NOT_SUSPENDED;
    return XML_STATUS_ERROR;
  }
  parser->m_parsingStatus.parsing = XML_PARSING;

  parser->m_errorCode = parser->m_processor(
      parser, parser->m_bufferPtr, parser->m_parseEndPtr, &parser->m_bufferPtr);

  if (parser->m_errorCode != XML_ERROR_NONE) {
    parser->m_eventEndPtr = parser->m_eventPtr;
    parser->m_processor = errorProcessor;
    return XML_STATUS_ERROR;
  } else {
    switch (parser->m_parsingStatus.parsing) {
    case XML_SUSPENDED:
      result = XML_STATUS_SUSPENDED;
      break;
    case XML_INITIALIZED:
    case XML_PARSING:
      if (parser->m_parsingStatus.finalBuffer) {
        parser->m_parsingStatus.parsing = XML_FINISHED;
        return result;
      }
    default:;
    }
  }

  XmlUpdatePosition(parser->m_encoding, parser->m_positionPtr,
                    parser->m_bufferPtr, &parser->m_position);
  parser->m_positionPtr = parser->m_bufferPtr;
  return result;
}